

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

bool __thiscall QMdi::ControllerWidget::event(ControllerWidget *this,QEvent *event)

{
  bool bVar1;
  SubControl subControl;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QStyleOptionComplex opt;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  QPalettePrivate *pQStack_b0;
  undefined1 *local_a8;
  QObject *pQStack_a0;
  undefined1 *local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(event + 8) == 0x6e) {
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_a0 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_b0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)local_d8,1,0xf0000);
    QStyleOption::initFrom((QStyleOption *)local_d8,&this->super_QWidget);
    local_98 = (undefined1 *)
               (ulong)(this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                      super_QFlagsStorage<QStyle::SubControl>.i;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)&local_88,1,0xf0000);
    QStyleOption::initFrom((QStyleOption *)&local_88,&this->super_QWidget);
    local_48 = (undefined1 *)
               (ulong)(this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                      super_QFlagsStorage<QStyle::SubControl>.i;
    pQVar2 = QWidget::style(&this->super_QWidget);
    subControl = (**(code **)(*(long *)pQVar2 + 0xd0))
                           (pQVar2,8,(QStyleOptionComplex *)&local_88,event + 0x10,this);
    QStyleOption::~QStyleOption((QStyleOption *)&local_88);
    showToolTip((QHelpEvent *)event,&this->super_QWidget,(QStyleOptionComplex *)local_d8,
                CC_MdiControls,subControl);
    QStyleOption::~QStyleOption((QStyleOption *)local_d8);
  }
  bVar1 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ControllerWidget::event(QEvent *event)
{
#if QT_CONFIG(tooltip)
    if (event->type() == QEvent::ToolTip) {
        QStyleOptionComplex opt;
        initStyleOption(&opt);
        QHelpEvent *helpEvent = static_cast<QHelpEvent *>(event);
        showToolTip(helpEvent, this, opt, QStyle::CC_MdiControls, getSubControl(helpEvent->pos()));
    }
#endif // QT_CONFIG(tooltip)
    return QWidget::event(event);
}